

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromCacheTest::createInstance
          (PipelineFromCacheTest *this,Context *context)

{
  VkResult VVar1;
  GraphicsCacheTestInstance *this_00;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *pDVar2;
  size_t dataSize;
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  ulong local_a0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_78;
  _func_int **local_58;
  Context *pCStack_50;
  undefined8 local_48;
  VkAllocationCallbacks *pVStack_40;
  DeviceInterface *local_38;
  
  this_00 = (GraphicsCacheTestInstance *)operator_new(0x598);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_00->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__PipelineFromCacheTestInstance_00bfa430;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = (DeviceInterface *)0x0;
  vk = Context::getDeviceInterface((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  local_a0 = 0;
  VVar1 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_00->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &local_a0,0);
  ::vk::checkResult(VVar1,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x5cd);
  pDVar2 = (DeviceInterface *)operator_new__(local_a0);
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = pDVar2;
  VVar1 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,device,
                     (this_00->super_CacheTestInstance).m_cache.
                     super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                     &local_a0);
  ::vk::checkResult(VVar1,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x5d1);
  local_58 = (_func_int **)CONCAT44(local_58._4_4_,VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO);
  pCStack_50 = (Context *)0x0;
  local_48 = (CacheTestParam *)((ulong)local_48._4_4_ << 0x20);
  pVStack_40 = (VkAllocationCallbacks *)local_a0;
  local_38 = this_00[1].super_CacheTestInstance.m_cmdPool.
             super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)&local_78,vk,device,
             (VkPipelineCacheCreateInfo *)&local_58,(VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
  local_98.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
  local_98.m_data.object.m_internal = local_78.m_data.object.m_internal;
  local_98.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)15>_> *)(this_00 + 1));
  this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)local_98.m_data.deleter.m_device;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = (deUint64)local_98.m_data.deleter.m_allocator;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)local_98.m_data.object.m_internal;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context =
       (Context *)local_98.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_78);
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&local_78,&this_00->m_renderSize);
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_98,
             (SimpleGraphicsPipelineBuilder *)&this_00->m_pipelineBuilder,(UVec2 *)&local_78,
             (VkRenderPass)
             (this_00->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance,
             (VkPipelineLayout)
             (this_00->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
             object.m_internal);
  local_48 = (CacheTestParam *)local_98.m_data.deleter.m_device;
  pVStack_40 = local_98.m_data.deleter.m_allocator;
  local_58 = (_func_int **)local_98.m_data.object.m_internal;
  pCStack_50 = (Context *)local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)local_48;
  this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       pVStack_40;
  this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)local_58;
  this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)pCStack_50;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_98);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* PipelineFromCacheTest::createInstance (Context& context) const
{
	return new PipelineFromCacheTestInstance(context, &m_param);
}